

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int pager_lock_db(Pager *pPager,int eLock)

{
  int iVar1;
  char *zErr;
  
  iVar1 = 0;
  if (pPager->iLock < eLock) {
    iVar1 = (*pPager->pfd->pMethods->xLock)(pPager->pfd,eLock);
    if (iVar1 == 0) {
      pPager->iLock = eLock;
      iVar1 = 0;
    }
    else {
      zErr = "Error while requesting database lock";
      if (iVar1 == -0xe) {
        zErr = "Another process or thread hold the requested lock";
      }
      unqliteGenError(pPager->pDb,zErr);
    }
  }
  return iVar1;
}

Assistant:

static int pager_lock_db(Pager *pPager, int eLock){
  int rc = UNQLITE_OK;
  if( pPager->iLock < eLock || pPager->iLock == NO_LOCK ){
    rc = unqliteOsLock(pPager->pfd, eLock);
    if( rc==UNQLITE_OK ){
      pPager->iLock = eLock;
    }else{
		unqliteGenError(pPager->pDb,
			rc == UNQLITE_BUSY ? "Another process or thread hold the requested lock" : "Error while requesting database lock"
			);
	}
  }
  return rc;
}